

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O2

int test(char *url)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  uint __i;
  int iVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  CURL **ppCVar8;
  undefined8 uVar9;
  CURL *pCVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  char *pcVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  timeval tVar21;
  int maxfd;
  int running;
  ulong local_1d8;
  void *local_1d0;
  long timeout;
  timeval interval;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  sVar6 = strlen(url);
  sVar6 = sVar6 + 5;
  pvVar7 = malloc(sVar6);
  tv_test_start = tutil_tvnow();
  if (pvVar7 == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    iVar4 = 0x7e;
  }
  else {
    ppCVar8 = easy;
    for (lVar15 = 0; lVar15 != 0xc; lVar15 = lVar15 + 4) {
      *ppCVar8 = (CURL *)0x0;
      *(undefined4 *)((long)sockets + lVar15) = 0xffffffff;
      ppCVar8 = ppCVar8 + 1;
    }
    local_1d0 = pvVar7;
    iVar4 = curl_global_init(3);
    uVar17 = _stderr;
    if (iVar4 == 0) {
      if (res == 0) {
        lVar15 = curl_multi_init();
        if (lVar15 == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                        ,0x7f);
          res = 0x7b;
        }
        else if (res == 0) {
          cVar3 = '\0';
          local_1d8 = 0;
LAB_001023fc:
          do {
            timeout = -99;
            maxfd = -99;
            if (cVar3 == '\0') {
              pCVar10 = (CURL *)curl_easy_init();
              easy[(int)local_1d8] = pCVar10;
              if (pCVar10 == (CURL *)0x0) {
                curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x92);
                res = 0x7c;
              }
              else if (res == 0) {
                ppCVar8 = easy + (int)local_1d8;
                if ((int)local_1d8 % 3 == 2) {
                  curl_msnprintf(local_1d0,sVar6,"%s0200",url);
                  iVar4 = curl_easy_setopt(*ppCVar8,0x6b,8);
                  uVar17 = _stderr;
                  if (iVar4 == 0) {
LAB_001024cb:
                    if (res != 0) break;
                    iVar4 = curl_easy_setopt(*ppCVar8,0x4a,1);
                    uVar17 = _stderr;
                    if (iVar4 == 0) {
                      if (res != 0) break;
                      iVar4 = curl_easy_setopt(*ppCVar8,0x2712,local_1d0);
                      uVar17 = _stderr;
                      if (iVar4 == 0) {
                        if (res != 0) break;
                        iVar4 = curl_easy_setopt(*ppCVar8,0x29,1);
                        uVar17 = _stderr;
                        if (iVar4 == 0) {
                          if (res != 0) break;
                          iVar4 = curl_easy_setopt(*ppCVar8,0x50,1);
                          uVar17 = _stderr;
                          if (iVar4 == 0) {
                            if (res != 0) break;
                            iVar4 = curl_easy_setopt(*ppCVar8,0x2715,"testuser:testpass");
                            uVar17 = _stderr;
                            if (iVar4 == 0) {
                              if (res != 0) break;
                              iVar4 = curl_easy_setopt(*ppCVar8,0x4e2b,callback);
                              uVar17 = _stderr;
                              if (iVar4 == 0) {
                                if (res != 0) break;
                                iVar4 = curl_easy_setopt(*ppCVar8,0x2711);
                                uVar17 = _stderr;
                                if (iVar4 == 0) {
                                  if (res != 0) break;
                                  iVar4 = curl_easy_setopt(*ppCVar8,0x2a,1);
                                  uVar17 = _stderr;
                                  if (iVar4 == 0) {
                                    if (res != 0) break;
                                    iVar4 = curl_multi_add_handle(lVar15,*ppCVar8);
                                    uVar17 = _stderr;
                                    if (iVar4 == 0) {
                                      if (res == 0) {
                                        local_1d8 = (ulong)((int)local_1d8 + 1);
                                        cVar3 = '\x01';
                                        goto LAB_00102665;
                                      }
                                      break;
                                    }
                                    uVar9 = curl_multi_strerror(iVar4);
                                    pcVar14 = 
                                    "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                                    uVar16 = 0xa5;
                                  }
                                  else {
                                    uVar9 = curl_easy_strerror(iVar4);
                                    pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n"
                                    ;
                                    uVar16 = 0xa3;
                                  }
                                }
                                else {
                                  uVar9 = curl_easy_strerror(iVar4);
                                  pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                  uVar16 = 0xa2;
                                }
                              }
                              else {
                                uVar9 = curl_easy_strerror(iVar4);
                                pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                uVar16 = 0xa1;
                              }
                            }
                            else {
                              uVar9 = curl_easy_strerror(iVar4);
                              pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                              uVar16 = 0xa0;
                            }
                          }
                          else {
                            uVar9 = curl_easy_strerror(iVar4);
                            pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                            uVar16 = 0x9f;
                          }
                        }
                        else {
                          uVar9 = curl_easy_strerror(iVar4);
                          pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                          uVar16 = 0x9e;
                        }
                      }
                      else {
                        uVar9 = curl_easy_strerror(iVar4);
                        pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                        uVar16 = 0x9d;
                      }
                    }
                    else {
                      uVar9 = curl_easy_strerror(iVar4);
                      pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                      uVar16 = 0x9c;
                    }
                  }
                  else {
                    uVar9 = curl_easy_strerror(iVar4);
                    pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar16 = 0x96;
                  }
                }
                else {
                  curl_msnprintf(local_1d0,sVar6,"%s0100",url);
                  iVar4 = curl_easy_setopt(*ppCVar8,0x6b,1);
                  uVar17 = _stderr;
                  if (iVar4 == 0) goto LAB_001024cb;
                  uVar9 = curl_easy_strerror(iVar4);
                  pcVar14 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uVar16 = 0x9a;
                }
LAB_00102d68:
                curl_mfprintf(uVar17,pcVar14,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,uVar16,iVar4,uVar9);
                res = iVar4;
              }
              break;
            }
LAB_00102665:
            iVar4 = curl_multi_perform(lVar15,&running);
            uVar17 = _stderr;
            if (iVar4 != 0) {
              uVar9 = curl_multi_strerror(iVar4);
              pcVar14 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar16 = 0xaa;
              goto LAB_00102d68;
            }
            if (running < 0) {
              pcVar14 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar17 = 0xaa;
LAB_00102a7a:
              curl_mfprintf(_stderr,pcVar14,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar17);
              res = 0x7a;
              break;
            }
            if (res != 0) break;
            tVar21 = tutil_tvnow();
            lVar11 = tutil_tvdiff(tVar21,tv_test_start);
            if (5000 < lVar11) {
              uVar17 = 0xac;
LAB_00102c26:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar17);
              res = 0x7d;
              break;
            }
            if ((res != 0) || ((cVar3 == '\x02' && (running == 0)))) break;
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              fdread.__fds_bits[lVar11] = 0;
            }
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              fdwrite.__fds_bits[lVar11] = 0;
            }
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              fdexcep.__fds_bits[lVar11] = 0;
            }
            iVar4 = curl_multi_fdset(lVar15,&fdread,&fdwrite,&fdexcep,&maxfd);
            uVar17 = _stderr;
            if (iVar4 != 0) {
              uVar9 = curl_multi_strerror(iVar4);
              pcVar14 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar16 = 0xb5;
              goto LAB_00102d68;
            }
            if (maxfd < -1) {
              pcVar14 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar17 = 0xb5;
              goto LAB_00102a7a;
            }
            if (res != 0) break;
            iVar4 = (int)local_1d8;
            iVar18 = iVar4 + -1;
            bVar2 = false;
            uVar19 = 0;
            if (0 < iVar4) {
              uVar19 = local_1d8 & 0xffffffff;
            }
            uVar12 = 0;
            while (iVar5 = (int)uVar12, iVar5 <= maxfd) {
              if (((ulong)fdread.__fds_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0) {
                lVar11 = 0;
                do {
                  if (uVar19 * 4 == lVar11) {
                    if ((cVar3 != '\x01') || (bVar2)) {
                      curl_mfprintf(_stderr,"Unexpected new socket\n");
                    }
                    else {
                      iVar1 = sockets[iVar18];
                      if (iVar1 == -1) {
                        sockets[iVar18] = iVar5;
                        bVar2 = true;
                        break;
                      }
                      if (iVar5 == iVar1) {
                        __assert_fail("curfd != sockets[num_handles-1]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                      ,0xd8,"int test(char *)");
                      }
                      curl_mfprintf(_stderr,"Handle %d wrote to socket %d then detected on %d\n",
                                    iVar18,iVar1,uVar12);
                    }
                    res = 0x7e;
                    goto LAB_00102d7b;
                  }
                  piVar13 = (int *)((long)sockets + lVar11);
                  lVar11 = lVar11 + 4;
                } while (*piVar13 != iVar5);
              }
              uVar12 = (ulong)(iVar5 + 1);
            }
            bVar20 = cVar3 == '\x01';
            cVar3 = '\x02';
            if (bVar20) {
              if ((maxfd != -1) && (!bVar2)) {
                curl_mfprintf(_stderr,
                              "Warning: socket did not open immediately for new handle (trying again)\n"
                             );
                cVar3 = '\x01';
                goto LAB_001023fc;
              }
              cVar3 = (2 < iVar4) * '\x02';
            }
            iVar4 = curl_multi_timeout(lVar15,&timeout);
            uVar17 = _stderr;
            if (iVar4 != 0) {
              uVar9 = curl_multi_strerror(iVar4);
              pcVar14 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
              uVar16 = 0xef;
              goto LAB_00102d68;
            }
            if (timeout < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xef,timeout);
              res = 0x73;
              break;
            }
            if (res != 0) break;
            iVar4 = (int)local_1d8;
            curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xf4,local_1d8 & 0xffffffff);
            if (timeout == -1) {
              interval.tv_sec = 6;
              interval.tv_usec = 0;
              if (iVar4 == 3 && running == 0) break;
            }
            else {
              uVar19 = timeout;
              if (0x7ffffffe < timeout) {
                uVar19 = 0x7fffffff;
              }
              uVar19 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
              interval.tv_sec = (__time_t)(int)((long)uVar19 / 1000);
              interval.tv_usec = (__suseconds_t)((int)((long)uVar19 % 1000) * 1000);
            }
            iVar4 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&interval);
            if (iVar4 == -1) {
              piVar13 = __errno_location();
              uVar17 = _stderr;
              iVar4 = *piVar13;
              pcVar14 = strerror(iVar4);
              curl_mfprintf(uVar17,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x107,iVar4,pcVar14);
              res = 0x79;
              break;
            }
            if (res != 0) break;
            tVar21 = tutil_tvnow();
            lVar11 = tutil_tvdiff(tVar21,tv_test_start);
            if (5000 < lVar11) {
              uVar17 = 0x109;
              goto LAB_00102c26;
            }
          } while (res == 0);
        }
LAB_00102d7b:
        for (lVar11 = 0; lVar11 != 0x18; lVar11 = lVar11 + 8) {
          curl_multi_remove_handle(lVar15,*(undefined8 *)((long)easy + lVar11));
          curl_easy_cleanup(*(undefined8 *)((long)easy + lVar11));
        }
        curl_multi_cleanup(lVar15);
        curl_global_cleanup();
        free(local_1d0);
        iVar4 = res;
        goto LAB_001023c6;
      }
    }
    else {
      uVar9 = curl_easy_strerror(iVar4);
      curl_mfprintf(uVar17,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x79,iVar4,uVar9);
      res = iVar4;
    }
    iVar4 = res;
    free(local_1d0);
  }
LAB_001023c6:
  return iVar4;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        snprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        snprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for(i = 0; i <= maxfd; ++i) {
      bool socket_exists = FALSE;
      curl_socket_t curfd = (curl_socket_t)i;

      if(!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for(j = 0; j < num_handles; ++j) {
        if(sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if(socket_exists) {
        continue;
      }

      if(found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if(sockets[num_handles-1] != CURL_SOCKET_BAD) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, (int)sockets[num_handles-1], (int)curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}